

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O3

bool __thiscall
llvm::DWARFDebugLine::LineTable::lookupAddressRange
          (LineTable *this,SectionedAddress Address,uint64_t Size,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Result)

{
  bool bVar1;
  bool bVar2;
  SectionedAddress Address_00;
  
  Address_00.Address = Address.Address;
  bVar1 = lookupAddressRangeImpl(this,Address,Size,Result);
  bVar2 = true;
  if (!bVar1) {
    if (Address.SectionIndex != 0xffffffffffffffff) {
      Address_00.SectionIndex = 0xffffffffffffffff;
      bVar1 = lookupAddressRangeImpl(this,Address_00,Size,Result);
      return bVar1;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool DWARFDebugLine::LineTable::lookupAddressRange(
    object::SectionedAddress Address, uint64_t Size,
    std::vector<uint32_t> &Result) const {

  // Search for relocatable addresses
  if (lookupAddressRangeImpl(Address, Size, Result))
    return true;

  if (Address.SectionIndex == object::SectionedAddress::UndefSection)
    return false;

  // Search for absolute addresses
  Address.SectionIndex = object::SectionedAddress::UndefSection;
  return lookupAddressRangeImpl(Address, Size, Result);
}